

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::any<std::shared_ptr<std::__cxx11::stringstream>>
          (any *this,
          shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dat)

{
  proxy *ppVar1;
  int local_1c;
  holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::stringstream>>,64ul,cs_impl::default_allocator_provider>
             ::alloc<std::shared_ptr<std::__cxx11::stringstream>const&>
                       ((allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::stringstream>>,64ul,cs_impl::default_allocator_provider>
                         *)holder<std::shared_ptr<std::__cxx11::stringstream>>::allocator,dat);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<std::shared_ptr<std::__cxx11::stringstream>>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}